

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall google::protobuf::Message::SetCachedSize(Message *this,int param_1)

{
  int iVar1;
  LogMessage *pLVar2;
  undefined4 extraout_var;
  LogFinisher local_49;
  LogMessage local_48;
  
  internal::LogMessage::LogMessage
            (&local_48,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
             ,0xb5);
  pLVar2 = internal::LogMessage::operator<<(&local_48,"Message class \"");
  iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[0x11])(this);
  pLVar2 = internal::LogMessage::operator<<
                     (pLVar2,(string *)(*(long *)(CONCAT44(extraout_var,iVar1) + 8) + 0x20));
  pLVar2 = internal::LogMessage::operator<<
                     (pLVar2,
                      "\" implements neither SetCachedSize() nor ByteSize().  Must implement one or the other."
                     );
  internal::LogFinisher::operator=(&local_49,pLVar2);
  internal::LogMessage::~LogMessage(&local_48);
  return;
}

Assistant:

void Message::SetCachedSize(int /* size */) const {
  GOOGLE_LOG(FATAL) << "Message class \"" << GetDescriptor()->full_name()
             << "\" implements neither SetCachedSize() nor ByteSize().  "
                "Must implement one or the other.";
}